

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# betti.h
# Opt level: O2

void __thiscall
betti_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
print_aggregated_results
          (betti_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this)

{
  ushort uVar1;
  ushort uVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> skipped;
  int top_dimension;
  undefined1 approximate_computation;
  undefined1 in_stack_ffffffffffffff88;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  top_dimension = (int)total_top_dimension;
  if (this->aggregate_results == true) {
    uVar1 = this->min_dimension;
    uVar2 = this->max_dimension;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,&total_cell_count)
    ;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,&total_betti);
    approximate_computation = 0xa0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,&total_skipped);
    skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = this->approximate_computation;
    skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_40;
    skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ =
         total_cell_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         total_cell_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    print_ordinary((ostream *)
                   &(this->
                    super_file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
                    ).outstream,(uint)uVar1,(uint)uVar2,top_dimension,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,skipped,
                   (bool)approximate_computation,(bool)in_stack_ffffffffffffff88);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_70);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
  }
  return;
}

Assistant:

void betti_output_t<Complex>::print_aggregated_results() {
	if (!aggregate_results) return;

	print_ordinary(file_output_t<Complex>::outstream, int(min_dimension), int(max_dimension), int(total_top_dimension),
	               total_cell_count, total_betti, total_skipped, approximate_computation, total_cell_count.size() > 0);
}